

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O3

size_t nghttp2_bufs_remove_copy(nghttp2_bufs *bufs,uint8_t *out)

{
  uint8_t *src;
  nghttp2_buf_chain *pnVar1;
  uint8_t *puVar2;
  nghttp2_buf_chain *pnVar3;
  
  pnVar3 = bufs->head;
  if (pnVar3 == (nghttp2_buf_chain *)0x0) {
    puVar2 = (uint8_t *)0x0;
  }
  else {
    puVar2 = (uint8_t *)0x0;
    pnVar1 = pnVar3;
    do {
      puVar2 = (pnVar1->buf).last + ((long)puVar2 - (long)(pnVar1->buf).pos);
      pnVar1 = pnVar1->next;
    } while (pnVar1 != (nghttp2_buf_chain *)0x0);
    for (; pnVar3 != (nghttp2_buf_chain *)0x0; pnVar3 = pnVar3->next) {
      src = (pnVar3->buf).pos;
      out = nghttp2_cpymem(out,src,(long)(pnVar3->buf).last - (long)src);
    }
  }
  return (size_t)puVar2;
}

Assistant:

size_t nghttp2_bufs_remove_copy(nghttp2_bufs *bufs, uint8_t *out) {
  size_t len;
  nghttp2_buf_chain *chain;
  nghttp2_buf *buf;
  nghttp2_buf resbuf;

  len = nghttp2_bufs_len(bufs);

  nghttp2_buf_wrap_init(&resbuf, out, len);

  for (chain = bufs->head; chain; chain = chain->next) {
    buf = &chain->buf;
    resbuf.last = nghttp2_cpymem(resbuf.last, buf->pos, nghttp2_buf_len(buf));
  }

  return len;
}